

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

void N_VDiv_Serial(N_Vector x,N_Vector y,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    lVar2 = *(long *)((long)x->content + 0x10);
    lVar3 = *(long *)((long)y->content + 0x10);
    lVar4 = *(long *)((long)z->content + 0x10);
    lVar5 = 0;
    do {
      *(double *)(lVar4 + lVar5 * 8) =
           *(double *)(lVar2 + lVar5 * 8) / *(double *)(lVar3 + lVar5 * 8);
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return;
}

Assistant:

void N_VDiv_Serial(N_Vector x, N_Vector y, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *yd, *zd;

  xd = yd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = xd[i] / yd[i]; }

  return;
}